

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

fasttext_vocab_t * cft_fasttext_get_vocab(fasttext_t *handle)

{
  size_type sVar1;
  fasttext_vocab_t *pfVar2;
  char **ppcVar3;
  int64_t *piVar4;
  char *pcVar5;
  reference pvVar6;
  string word;
  int32_t i;
  int64_t *freqs;
  char **words;
  fasttext_vocab_t *ret;
  size_t len;
  vector<long,_std::allocator<long>_> vocab_freq;
  shared_ptr<const_fasttext::Dictionary> d;
  FastText *in_stack_ffffffffffffff58;
  vector<long,_std::allocator<long>_> *this;
  Dictionary *in_stack_ffffffffffffff78;
  int local_64;
  undefined8 in_stack_ffffffffffffffa0;
  entry_type type;
  Dictionary *in_stack_ffffffffffffffa8;
  vector<long,_std::allocator<long>_> local_30;
  vector<long,_std::allocator<long>_> local_18;
  
  type = (entry_type)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  this = &local_18;
  fasttext::FastText::getDictionary(in_stack_ffffffffffffff58);
  std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x18f663);
  fasttext::Dictionary::getCounts(in_stack_ffffffffffffffa8,type);
  sVar1 = std::vector<long,_std::allocator<long>_>::size(&local_30);
  pfVar2 = (fasttext_vocab_t *)malloc(0x18);
  pfVar2->length = sVar1;
  ppcVar3 = (char **)malloc(sVar1 << 3);
  piVar4 = (int64_t *)malloc(sVar1 << 3);
  local_64 = 0;
  while( true ) {
    sVar1 = std::vector<long,_std::allocator<long>_>::size(&local_30);
    if (sVar1 <= (ulong)(long)local_64) break;
    std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x18f700);
    fasttext::Dictionary::getWord_abi_cxx11_
              (in_stack_ffffffffffffff78,(int32_t)((ulong)this >> 0x20));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar5 = strdup(pcVar5);
    ppcVar3[local_64] = pcVar5;
    pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](&local_30,(long)local_64);
    piVar4[local_64] = *pvVar6;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    local_64 = local_64 + 1;
  }
  pfVar2->words = ppcVar3;
  pfVar2->freqs = piVar4;
  std::vector<long,_std::allocator<long>_>::~vector(this);
  std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
            ((shared_ptr<const_fasttext::Dictionary> *)0x18f7d6);
  return pfVar2;
}

Assistant:

fasttext_vocab_t* cft_fasttext_get_vocab(fasttext_t* handle) {
    std::shared_ptr<const fasttext::Dictionary> d = ((FastText*)handle)->getDictionary();
    std::vector<int64_t> vocab_freq = d->getCounts(fasttext::entry_type::word);
    size_t len = vocab_freq.size();

    fasttext_vocab_t* ret = static_cast<fasttext_vocab_t*>(malloc(sizeof(fasttext_vocab_t)));
    ret->length = len;
    char** words = static_cast<char**>(malloc(sizeof(char*) * len));
    int64_t* freqs = static_cast<int64_t*>(malloc(sizeof(int64_t) * len));
    for (int32_t i = 0; i < vocab_freq.size(); i++) {
        std::string word = d->getWord(i);
        words[i] = strdup(word.c_str());
        freqs[i] = vocab_freq[i];
    }
    ret->words = words;
    ret->freqs = freqs;
    return ret;
}